

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getfilecontents.c
# Opt level: O2

econf_err read_file_with_callback
                    (econf_file **key_file,char *file_name,char *delim,char *comment,
                    _func__Bool_char_ptr_void_ptr *callback,void *callback_data)

{
  char cVar1;
  econf_file *ef;
  _Bool _Var2;
  undefined4 in_EAX;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  undefined1 auVar7 [16];
  econf_err t_err;
  uint local_138;
  stat sb;
  
  auVar7._0_4_ = -(uint)(key_file == (econf_file **)0x0);
  auVar7._4_4_ = -(uint)(file_name == (char *)0x0);
  auVar7._8_4_ = -(uint)(delim == (char *)0x0);
  auVar7._12_4_ = -(uint)(comment == (char *)0x0);
  iVar3 = movmskps(in_EAX,auVar7);
  if (iVar3 != 0) {
    return ECONF_ERROR;
  }
  iVar3 = lstat(file_name,(stat *)&sb);
  if (iVar3 == -1) {
LAB_00104470:
    t_err = ECONF_NOFILE;
  }
  else {
    if ((allow_follow_symlinks == false) && ((sb.st_mode & 0xf000) == 0xa000)) {
      return ECONF_ERROR_FILE_IS_SYM_LINK;
    }
    if ((file_owner_set == true) && (sb.st_uid != file_owner)) {
      return ECONF_WRONG_OWNER;
    }
    if ((file_group_set == true) && (sb.st_gid != file_group)) {
      return ECONF_WRONG_GROUP;
    }
    if (file_permissions_set == true) {
      if ((sb.st_mode & file_perms_file) == 0) {
        return ECONF_WRONG_FILE_PERMISSION;
      }
      pcVar4 = strdup(file_name);
      pcVar5 = dirname(pcVar4);
      iVar3 = lstat(pcVar5,(stat *)&t_err);
      free(pcVar4);
      if (iVar3 == -1) goto LAB_00104470;
      if ((local_138 & file_perms_dir) == 0) {
        return ECONF_WRONG_DIR_PERMISSION;
      }
    }
    if ((callback == (_func__Bool_char_ptr_void_ptr *)0x0) ||
       (_Var2 = (*callback)(file_name,callback_data), _Var2)) {
      pcVar4 = get_absolute_path(file_name,&t_err);
      if (pcVar4 != (char *)0x0) {
        cVar1 = *comment;
        ef = *key_file;
        cVar6 = '#';
        if (cVar1 != '\0') {
          cVar6 = cVar1;
        }
        pcVar5 = "#";
        if (cVar1 != '\0') {
          pcVar5 = comment;
        }
        ef->comment = cVar6;
        t_err = read_file(ef,pcVar4,delim,pcVar5);
        free(pcVar4);
        if (t_err == ECONF_SUCCESS) {
          t_err = ECONF_SUCCESS;
        }
        else {
          econf_freeFile(*key_file);
          *key_file = (econf_file *)0x0;
        }
      }
    }
    else {
      t_err = ECONF_PARSING_CALLBACK_FAILED;
    }
  }
  return t_err;
}

Assistant:

econf_err
read_file_with_callback(econf_file **key_file, const char *file_name,
			const char *delim, const char *comment,
			bool (*callback)(const char *filename, const void *data),
			const void *callback_data)
{
  econf_err t_err;
  struct stat sb;

  if (key_file == NULL || file_name == NULL || delim == NULL || comment == NULL)
    return ECONF_ERROR;

  // Checking file permissions, uid, group,...
  if (lstat(file_name, &sb) == -1)
    return ECONF_NOFILE;
  if (!allow_follow_symlinks && (sb.st_mode&S_IFMT) == S_IFLNK)
    return ECONF_ERROR_FILE_IS_SYM_LINK;
  if (file_owner_set && sb.st_uid != file_owner)
    return ECONF_WRONG_OWNER;
  if (file_group_set && sb.st_gid != file_group)
    return ECONF_WRONG_GROUP;
  if (file_permissions_set) {
    struct stat sb_dir;
    if (!(sb.st_mode&file_perms_file))
      return ECONF_WRONG_FILE_PERMISSION;
    char *cdirc = strdup(file_name);
    int dir_stat = lstat(dirname(cdirc), &sb_dir);
    free(cdirc);
    if ( dir_stat == -1)
      return ECONF_NOFILE;
    if (!(sb_dir.st_mode&file_perms_dir))
      return ECONF_WRONG_DIR_PERMISSION;
  }

  // calling user defined checks
  if (callback != NULL && !(*callback)(file_name, callback_data))
    return ECONF_PARSING_CALLBACK_FAILED;

  // Get absolute path if not provided
  char *absolute_path = get_absolute_path(file_name, &t_err);
  if (absolute_path == NULL)
    return t_err;

  if (*comment)
    (*key_file)->comment = comment[0];
  else {
    (*key_file)->comment = '#';
    comment = "#";
  }

  t_err = read_file(*key_file, absolute_path, delim, comment);

  free (absolute_path);

  if(t_err) {
    econf_free(*key_file);
    *key_file = NULL;
    return t_err;
  }

  return ECONF_SUCCESS;
}